

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regiongraph.h
# Opt level: O2

void __thiscall libDAI::RegionGraph::RegionGraph(RegionGraph *this,FactorGraph *fg)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_GraphicalModel)._normType = NORMPROB;
  (this->super_GraphicalModel)._vptr_GraphicalModel = (_func_int **)&PTR__RegionGraph_0061eaa0;
  FactorGraph::FactorGraph(&this->_fg,fg);
  p_Var1 = &(this->_fac2OR)._M_t._M_impl.super__Rb_tree_header;
  (this->_rg)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rg)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_rg)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rg)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rg)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->_fac2OR)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_fac2OR)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_fac2OR)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_rg)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_rg)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rg)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rg)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_rg)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rg)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rg)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_rg)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rg)._V1.super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rg)._V1.super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rg)._V1.super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_rg)._V2.super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rg)._V2.super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rg)._V2.super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_rg)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rg)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_fac2OR)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_fac2OR)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_fac2OR)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

RegionGraph(const FactorGraph & fg) : GraphicalModel(), _fg(fg), _rg(), _fac2OR() {}